

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_DoTimerB2(opm_t *chip)

{
  bool local_15;
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  opm_t *chip_local;
  
  local_11 = true;
  if (chip->mode_test[2] == '\0') {
    local_12 = false;
    if (chip->timer_loadb != '\0') {
      local_12 = chip->timer_b_sub_of != '\0';
    }
    local_11 = local_12;
  }
  chip->timer_b_inc = local_11;
  local_13 = true;
  if (chip->timer_b_of == '\0') {
    local_14 = false;
    if (chip->timer_loadb != '\0') {
      local_14 = chip->timer_b_temp != '\0';
    }
    local_13 = local_14;
  }
  chip->timer_b_do_load = local_13;
  chip->timer_b_do_reset = chip->timer_b_temp;
  chip->timer_b_temp = (chip->timer_loadb != '\0' ^ 0xffU) & 1;
  if ((chip->timer_resetb == '\0') && (chip->ic == '\0')) {
    local_15 = false;
    if (chip->timer_irqb != '\0') {
      local_15 = chip->timer_b_of != '\0';
    }
    chip->timer_b_status = chip->timer_b_status | local_15;
  }
  else {
    chip->timer_b_status = '\0';
  }
  chip->timer_resetb = '\0';
  return;
}

Assistant:

static void OPM_DoTimerB2(opm_t *chip)
{
    chip->timer_b_inc = chip->mode_test[2] || (chip->timer_loadb && chip->timer_b_sub_of);
    chip->timer_b_do_load = chip->timer_b_of || (chip->timer_loadb && chip->timer_b_temp);
    chip->timer_b_do_reset = chip->timer_b_temp;
    chip->timer_b_temp = !chip->timer_loadb;
    if (chip->timer_resetb || chip->ic)
    {
        chip->timer_b_status = 0;
    }
    else
    {
        chip->timer_b_status |= chip->timer_irqb && chip->timer_b_of;
    }
    chip->timer_resetb = 0;
}